

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.hpp
# Opt level: O2

OptionMap * DefaultOptions(void)

{
  map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_> *in_RDI;
  initializer_list<std::pair<const_Option,_int>_> __l;
  allocator_type local_3a;
  less<Option> local_39;
  pair<const_Option,_int> local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 2;
  uStack_20 = 3;
  local_38.first = ExternalVRR;
  local_38.second = 0;
  uStack_30 = 1;
  local_18 = 4;
  __l._M_len = 5;
  __l._M_array = &local_38;
  std::map<Option,_int,_std::less<Option>,_std::allocator<std::pair<const_Option,_int>_>_>::map
            (in_RDI,__l,&local_39,&local_3a);
  return in_RDI;
}

Assistant:

inline OptionMap DefaultOptions(void)
{
    return OptionMap{
                      {Option::ExternalVRR, 0},
                      {Option::GeneralVRR, 0},
                      {Option::ExternalHRR, 0},
                      {Option::GeneralHRR, 0},
                      {Option::FinalPermute, 0},
                    };
}